

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void log_secret(ptls_t *tls,char *type,ptls_iovec_t secret)

{
  _func_void_st_ptls_log_event_t_ptr_ptls_t_ptr_char_ptr_char_ptr_varargs *p_Var1;
  st_ptls_log_event_t *psVar2;
  char *pcVar3;
  char local_b8 [8];
  char hexbuf [129];
  char *type_local;
  ptls_t *tls_local;
  ptls_iovec_t secret_local;
  
  if (tls->ctx->log_event != (ptls_log_event_t *)0x0) {
    p_Var1 = tls->ctx->log_event->cb;
    psVar2 = tls->ctx->log_event;
    pcVar3 = ptls_hexdump(local_b8,secret.base,secret.len);
    (*p_Var1)(psVar2,tls,type,"%s",pcVar3);
  }
  return;
}

Assistant:

static void log_secret(ptls_t *tls, const char *type, ptls_iovec_t secret)
{
    char hexbuf[PTLS_MAX_DIGEST_SIZE * 2 + 1];

    PTLS_PROBE(NEW_SECRET, tls, type, ptls_hexdump(hexbuf, secret.base, secret.len));

    if (tls->ctx->log_event != NULL)
        tls->ctx->log_event->cb(tls->ctx->log_event, tls, type, "%s", ptls_hexdump(hexbuf, secret.base, secret.len));
}